

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_getBindingValue
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler,
          sysbvm_tuple_t binding)

{
  sysbvm_functionBytecodeAssembler_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t typeSlot;
  sysbvm_tuple_t value;
  sysbvm_tuple_t local_38;
  
  _Var2 = sysbvm_tuple_isKindOf(context,binding,(context->roots).symbolTupleSlotBindingType);
  if (_Var2) {
    sVar3 = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                      (context,compiler,*(sysbvm_tuple_t *)(binding + 0x48));
    psVar1 = compiler->assembler;
    sVar4 = sysbvm_typeSlot_getValidReferenceType(context,*(sysbvm_tuple_t *)(binding + 0x50));
    sVar4 = sysbvm_functionBytecodeAssembler_newTemporary(context,psVar1,sVar4);
    _Var2 = sysbvm_type_isPointerLikeType(*(sysbvm_tuple_t *)(*(long *)(binding + 0x48) + 0x30));
    psVar1 = compiler->assembler;
    typeSlot = sysbvm_functionBytecodeAssembler_addLiteral
                         (context,psVar1,*(sysbvm_tuple_t *)(binding + 0x50));
    local_38 = sVar4;
    if (_Var2) {
      sysbvm_functionBytecodeAssembler_refSlotReferenceAt(context,psVar1,sVar4,sVar3,typeSlot);
    }
    else {
      sysbvm_functionBytecodeAssembler_slotReferenceAt(context,psVar1,sVar4,sVar3,typeSlot);
    }
  }
  else {
    _Var2 = sysbvm_symbolBinding_isValue(context,binding);
    if (_Var2) {
      if ((binding & 0xf) == 0 && binding != 0) {
        sVar3 = *(sysbvm_tuple_t *)(binding + 0x30);
      }
      else {
        sVar3 = 0;
      }
      sVar3 = sysbvm_functionBytecodeAssembler_newTemporary(context,compiler->assembler,sVar3);
      sVar4 = sysbvm_functionBytecodeAssembler_addLiteral(context,compiler->assembler,binding);
      sysbvm_functionBytecodeAssembler_loadSymbolValueBinding
                (context,compiler->assembler,sVar3,sVar4);
      local_38 = sVar3;
    }
    else {
      local_38 = 0;
      _Var2 = sysbvm_methodDictionary_find(compiler->bindingDictionary,binding,&local_38);
      if (!_Var2) {
        sysbvm_error("Invalid value binding.");
      }
    }
  }
  return local_38;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_getBindingValue(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler, sysbvm_tuple_t binding)
{
    (void)context;
    if(sysbvm_tuple_isKindOf(context, binding, context->roots.symbolTupleSlotBindingType))
    {
        sysbvm_symbolTupleSlotBinding_t *bindingObject = (sysbvm_symbolTupleSlotBinding_t*)binding;
        sysbvm_tuple_t tupleValue = sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, compiler, bindingObject->tupleBinding);
        sysbvm_tuple_t reference = sysbvm_functionBytecodeAssembler_newTemporary(context, compiler->assembler, sysbvm_typeSlot_getValidReferenceType(context, bindingObject->typeSlot));

        sysbvm_symbolBinding_t *tupleBindingObject = (sysbvm_symbolBinding_t*)bindingObject->tupleBinding;

        if(sysbvm_type_isPointerLikeType(tupleBindingObject->type))
            sysbvm_functionBytecodeAssembler_refSlotReferenceAt(context, compiler->assembler, reference, tupleValue, sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, bindingObject->typeSlot));
        else
            sysbvm_functionBytecodeAssembler_slotReferenceAt(context, compiler->assembler, reference, tupleValue, sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, bindingObject->typeSlot));
        return reference;
    }

    if(sysbvm_symbolBinding_isValue(context, binding))
    {
        sysbvm_tuple_t valueTemp = sysbvm_functionBytecodeAssembler_newTemporary(context, compiler->assembler, sysbvm_symbolBinding_getType(binding));
        sysbvm_tuple_t bindingLiteral = sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, binding);
        sysbvm_functionBytecodeAssembler_loadSymbolValueBinding(context, compiler->assembler, valueTemp, bindingLiteral);
        return valueTemp;
    }

    sysbvm_tuple_t value = SYSBVM_NULL_TUPLE;
    sysbvm_functionBytecodeDirectCompiler_t *compilerObject = (sysbvm_functionBytecodeDirectCompiler_t*)compiler;
    if(!sysbvm_methodDictionary_find(compilerObject->bindingDictionary, binding, &value))
        sysbvm_error("Invalid value binding.");

    return value;
}